

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

Float pbrt::SphericalTriangleArea(Vector3f a,Vector3f b,Vector3f c)

{
  float __x;
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  float fVar23;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar36 [64];
  undefined1 auVar40 [64];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined4 local_98;
  undefined4 local_58;
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar40._4_60_ = c._12_60_;
  auVar40._0_4_ = c.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._8_56_ = c._8_56_;
  auVar36._0_8_ = c.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar32._4_60_ = b._12_60_;
  auVar32._0_4_ = b.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._8_56_ = b._8_56_;
  auVar30._0_8_ = b.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._4_60_ = a._12_60_;
  auVar25._0_4_ = a.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._8_56_ = a._8_56_;
  auVar19._0_8_ = a.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26 = auVar30._0_16_;
  auVar24 = auVar25._0_16_;
  auVar27 = ZEXT416((uint)(a.super_Tuple3<pbrt::Vector3,_float>.x * auVar32._0_4_));
  auVar7 = vfmsub213ss_fma(auVar26,auVar24,auVar27);
  auVar10 = auVar19._0_16_;
  auVar6 = auVar32._0_16_;
  auVar27 = vfnmadd231ss_fma(auVar27,auVar10,auVar6);
  fVar41 = auVar7._0_4_ + auVar27._0_4_;
  auVar4 = vpermt2ps_avx512vl(auVar10,_DAT_005670a0,auVar24);
  auVar27._0_4_ = auVar4._0_4_ * b.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar27._4_4_ = auVar4._4_4_ * b.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar27._8_4_ = auVar4._8_4_ * b.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._12_4_ = auVar4._12_4_ * b._12_4_;
  auVar5 = vpermt2ps_avx512vl(auVar26,_DAT_005670a0,auVar6);
  auVar7 = vfmsub213ps_fma(auVar5,auVar10,auVar27);
  auVar27 = vfnmadd231ps_fma(auVar27,auVar4,auVar26);
  fVar42 = auVar7._0_4_ + auVar27._0_4_;
  fVar43 = auVar7._4_4_ + auVar27._4_4_;
  fVar44 = auVar7._8_4_ + auVar27._8_4_;
  fVar45 = auVar7._12_4_ + auVar27._12_4_;
  auVar35._0_4_ = fVar42 * fVar42;
  auVar35._4_4_ = fVar43 * fVar43;
  auVar35._8_4_ = fVar44 * fVar44;
  auVar35._12_4_ = fVar45 * fVar45;
  auVar7 = vmovshdup_avx(auVar35);
  fVar9 = auVar35._0_4_ + auVar7._0_4_ + fVar41 * fVar41;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    auVar35 = auVar36._0_16_;
    auVar27 = ZEXT416((uint)(b.super_Tuple3<pbrt::Vector3,_float>.x * auVar40._0_4_));
    auVar7 = vfmsub213ss_fma(auVar6,auVar35,auVar27);
    auVar11 = auVar40._0_16_;
    auVar27 = vfnmadd231ss_fma(auVar27,auVar26,auVar11);
    fVar23 = auVar27._0_4_ + auVar7._0_4_;
    auVar31._0_4_ = auVar5._0_4_ * c.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar31._4_4_ = auVar5._4_4_ * c.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar31._8_4_ = auVar5._8_4_ * c.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar31._12_4_ = auVar5._12_4_ * c._12_4_;
    auVar6 = vpermi2ps_avx512vl(_DAT_005670a0,auVar35,auVar11);
    auVar7 = vfmsub213ps_fma(auVar26,auVar6,auVar31);
    auVar27 = vfnmadd213ps_fma(auVar5,auVar35,auVar31);
    local_38._0_4_ = auVar27._0_4_ + auVar7._0_4_;
    local_38._4_4_ = auVar27._4_4_ + auVar7._4_4_;
    local_38._8_4_ = auVar27._8_4_ + auVar7._8_4_;
    local_38._12_4_ = auVar27._12_4_ + auVar7._12_4_;
    auVar5._0_4_ = (float)local_38._0_4_ * (float)local_38._0_4_;
    auVar5._4_4_ = (float)local_38._4_4_ * (float)local_38._4_4_;
    auVar5._8_4_ = (float)local_38._8_4_ * (float)local_38._8_4_;
    auVar5._12_4_ = (float)local_38._12_4_ * (float)local_38._12_4_;
    auVar7 = vmovshdup_avx(auVar5);
    fVar8 = auVar5._0_4_ + auVar7._0_4_ + fVar23 * fVar23;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      auVar27 = ZEXT416((uint)(c.super_Tuple3<pbrt::Vector3,_float>.x * auVar25._0_4_));
      auVar7 = vfmsub213ss_fma(auVar11,auVar10,auVar27);
      auVar27 = vfnmadd213ss_fma(auVar24,auVar35,auVar27);
      fVar34 = auVar7._0_4_ + auVar27._0_4_;
      auVar24._0_4_ = auVar6._0_4_ * a.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar24._4_4_ = auVar6._4_4_ * a.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar24._8_4_ = auVar6._8_4_ * a.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar24._12_4_ = auVar6._12_4_ * a._12_4_;
      auVar7 = vfmsub213ps_fma(auVar4,auVar35,auVar24);
      auVar27 = vfnmadd213ps_fma(auVar10,auVar6,auVar24);
      fVar33 = auVar7._0_4_ + auVar27._0_4_;
      fVar37 = auVar7._4_4_ + auVar27._4_4_;
      fVar38 = auVar7._8_4_ + auVar27._8_4_;
      fVar39 = auVar7._12_4_ + auVar27._12_4_;
      auVar4._0_4_ = fVar33 * fVar33;
      auVar4._4_4_ = fVar37 * fVar37;
      auVar4._8_4_ = fVar38 * fVar38;
      auVar4._12_4_ = fVar39 * fVar39;
      auVar7 = vmovshdup_avx(auVar4);
      __x = auVar4._0_4_ + auVar7._0_4_ + fVar34 * fVar34;
      if ((__x != 0.0) || (NAN(__x))) {
        if (fVar9 < 0.0) {
          fVar9 = sqrtf(fVar9);
        }
        else {
          auVar7 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
          fVar9 = auVar7._0_4_;
        }
        auVar7._4_4_ = fVar9;
        auVar7._0_4_ = fVar9;
        auVar7._8_4_ = fVar9;
        auVar7._12_4_ = fVar9;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          auVar27 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
          fVar8 = auVar27._0_4_;
        }
        auVar10._4_4_ = fVar43;
        auVar10._0_4_ = fVar42;
        auVar10._8_4_ = fVar44;
        auVar10._12_4_ = fVar45;
        fVar41 = fVar41 / fVar9;
        auVar7 = vdivps_avx(auVar10,auVar7);
        auVar26._4_4_ = fVar8;
        auVar26._0_4_ = fVar8;
        auVar26._8_4_ = fVar8;
        auVar26._12_4_ = fVar8;
        if (__x < 0.0) {
          fVar9 = sqrtf(__x);
        }
        else {
          auVar27 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
          fVar9 = auVar27._0_4_;
        }
        fVar23 = fVar23 / fVar8;
        auVar27 = vdivps_avx(local_38,auVar26);
        fVar34 = fVar34 / fVar9;
        auVar11._4_4_ = fVar9;
        auVar11._0_4_ = fVar9;
        auVar11._8_4_ = fVar9;
        auVar11._12_4_ = fVar9;
        auVar6._4_4_ = fVar37;
        auVar6._0_4_ = fVar33;
        auVar6._8_4_ = fVar38;
        auVar6._12_4_ = fVar39;
        auVar4 = vdivps_avx(auVar6,auVar11);
        auVar12._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
        auVar12._8_4_ = auVar4._8_4_ ^ 0x80000000;
        auVar12._12_4_ = auVar4._12_4_ ^ 0x80000000;
        auVar10 = vshufps_avx(auVar12,auVar12,0xf5);
        auVar5 = vmovshdup_avx(auVar7);
        auVar5 = vfmsub213ss_fma(auVar5,auVar10,ZEXT416((uint)(fVar41 * fVar34)));
        auVar5 = vfnmadd231ss_fma(auVar5,auVar7,auVar4);
        if (0.0 <= auVar5._0_4_) {
          auVar5 = vsubps_avx(auVar12,auVar7);
          auVar13._0_4_ = auVar5._0_4_ * auVar5._0_4_;
          auVar13._4_4_ = auVar5._4_4_ * auVar5._4_4_;
          auVar13._8_4_ = auVar5._8_4_ * auVar5._8_4_;
          auVar13._12_4_ = auVar5._12_4_ * auVar5._12_4_;
          auVar5 = vmovshdup_avx(auVar13);
          fVar9 = auVar13._0_4_ + auVar5._0_4_ + (-fVar34 - fVar41) * (-fVar34 - fVar41);
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            auVar5 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
            fVar9 = auVar5._0_4_;
          }
          auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar9 * 0.5)));
          uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar9 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          local_58 = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar5._0_4_));
          local_58 = local_58 + local_58;
        }
        else {
          auVar5 = vsubps_avx(auVar7,auVar4);
          auVar28._0_4_ = auVar5._0_4_ * auVar5._0_4_;
          auVar28._4_4_ = auVar5._4_4_ * auVar5._4_4_;
          auVar28._8_4_ = auVar5._8_4_ * auVar5._8_4_;
          auVar28._12_4_ = auVar5._12_4_ * auVar5._12_4_;
          auVar5 = vmovshdup_avx(auVar28);
          fVar9 = auVar28._0_4_ + auVar5._0_4_ + (fVar41 - fVar34) * (fVar41 - fVar34);
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            auVar5 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
            fVar9 = auVar5._0_4_;
          }
          auVar5 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar9 * 0.5)));
          uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar9 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          auVar20._0_4_ = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar5._0_4_));
          auVar20._4_60_ = extraout_var;
          auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar20._0_16_,ZEXT416(0x40490fdb)
                                  );
          local_58 = auVar5._0_4_;
        }
        auVar14._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
        auVar14._8_4_ = auVar7._8_4_ ^ 0x80000000;
        auVar14._12_4_ = auVar7._12_4_ ^ 0x80000000;
        auVar10 = vshufps_avx(auVar14,auVar14,0xf5);
        auVar5 = vmovshdup_avx(auVar27);
        auVar5 = vfmsub213ss_fma(auVar5,auVar10,ZEXT416((uint)(fVar23 * fVar41)));
        auVar5 = vfnmadd231ss_fma(auVar5,auVar27,auVar7);
        if (0.0 <= auVar5._0_4_) {
          auVar7 = vsubps_avx(auVar14,auVar27);
          auVar15._0_4_ = auVar7._0_4_ * auVar7._0_4_;
          auVar15._4_4_ = auVar7._4_4_ * auVar7._4_4_;
          auVar15._8_4_ = auVar7._8_4_ * auVar7._8_4_;
          auVar15._12_4_ = auVar7._12_4_ * auVar7._12_4_;
          auVar7 = vmovshdup_avx(auVar15);
          fVar41 = auVar15._0_4_ + auVar7._0_4_ + (-fVar41 - fVar23) * (-fVar41 - fVar23);
          if (fVar41 < 0.0) {
            fVar41 = sqrtf(fVar41);
          }
          else {
            auVar7 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
            fVar41 = auVar7._0_4_;
          }
          auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar41 * 0.5)));
          uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar41 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          local_98 = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar7._0_4_));
          local_98 = local_98 + local_98;
        }
        else {
          auVar7 = vsubps_avx(auVar27,auVar7);
          auVar29._0_4_ = auVar7._0_4_ * auVar7._0_4_;
          auVar29._4_4_ = auVar7._4_4_ * auVar7._4_4_;
          auVar29._8_4_ = auVar7._8_4_ * auVar7._8_4_;
          auVar29._12_4_ = auVar7._12_4_ * auVar7._12_4_;
          auVar7 = vmovshdup_avx(auVar29);
          fVar41 = auVar29._0_4_ + auVar7._0_4_ + (fVar23 - fVar41) * (fVar23 - fVar41);
          if (fVar41 < 0.0) {
            fVar41 = sqrtf(fVar41);
          }
          else {
            auVar7 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
            fVar41 = auVar7._0_4_;
          }
          auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar41 * 0.5)));
          uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar41 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          auVar21._0_4_ = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar7._0_4_));
          auVar21._4_60_ = extraout_var_00;
          auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar21._0_16_,ZEXT416(0x40490fdb)
                                  );
          local_98 = auVar7._0_4_;
        }
        auVar16._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
        auVar16._8_4_ = auVar27._8_4_ ^ 0x80000000;
        auVar16._12_4_ = auVar27._12_4_ ^ 0x80000000;
        auVar5 = vshufps_avx(auVar16,auVar16,0xf5);
        auVar7 = vmovshdup_avx(auVar4);
        auVar7 = vfmsub213ss_fma(auVar7,auVar5,ZEXT416((uint)(fVar34 * fVar23)));
        auVar7 = vfnmadd231ss_fma(auVar7,auVar4,auVar27);
        if (0.0 <= auVar7._0_4_) {
          auVar7 = vsubps_avx(auVar16,auVar4);
          auVar18._0_4_ = auVar7._0_4_ * auVar7._0_4_;
          auVar18._4_4_ = auVar7._4_4_ * auVar7._4_4_;
          auVar18._8_4_ = auVar7._8_4_ * auVar7._8_4_;
          auVar18._12_4_ = auVar7._12_4_ * auVar7._12_4_;
          auVar7 = vmovshdup_avx(auVar18);
          fVar41 = auVar18._0_4_ + auVar7._0_4_ + (-fVar23 - fVar34) * (-fVar23 - fVar34);
          if (fVar41 < 0.0) {
            fVar41 = sqrtf(fVar41);
          }
          else {
            auVar7 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
            fVar41 = auVar7._0_4_;
          }
          auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar41 * 0.5)));
          uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar41 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          fVar41 = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar7._0_4_));
          fVar41 = fVar41 + fVar41;
        }
        else {
          auVar7 = vsubps_avx(auVar4,auVar27);
          auVar17._0_4_ = auVar7._0_4_ * auVar7._0_4_;
          auVar17._4_4_ = auVar7._4_4_ * auVar7._4_4_;
          auVar17._8_4_ = auVar7._8_4_ * auVar7._8_4_;
          auVar17._12_4_ = auVar7._12_4_ * auVar7._12_4_;
          auVar7 = vmovshdup_avx(auVar17);
          fVar41 = auVar17._0_4_ + auVar7._0_4_ + (fVar34 - fVar23) * (fVar34 - fVar23);
          if (fVar41 < 0.0) {
            fVar41 = sqrtf(fVar41);
          }
          else {
            auVar7 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
            fVar41 = auVar7._0_4_;
          }
          auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar41 * 0.5)));
          uVar1 = vcmpss_avx512f(ZEXT416((uint)(fVar41 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)uVar1 & 1);
          auVar22._0_4_ = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar7._0_4_));
          auVar22._4_60_ = extraout_var_01;
          auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar22._0_16_,ZEXT416(0x40490fdb)
                                  );
          fVar41 = auVar7._0_4_;
        }
        auVar3._8_4_ = 0x7fffffff;
        auVar3._0_8_ = 0x7fffffff7fffffff;
        auVar3._12_4_ = 0x7fffffff;
        auVar7 = vandps_avx512vl(ZEXT416((uint)(local_98 + local_58 + fVar41 + -3.1415927)),auVar3);
        return auVar7._0_4_;
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU inline auto DifferenceOfProducts(Ta a, Tb b, Tc c, Td d) {
    auto cd = c * d;
    auto differenceOfProducts = FMA(a, b, -cd);
    auto error = FMA(-c, d, cd);
    return differenceOfProducts + error;
}